

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode
dense_alloc_matrix(CUPDLPdense *dense,cupdlp_int nRows,cupdlp_int nCols,void *src,
                  CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  cupdlp_float *pcVar1;
  CUPDLPcsc *in_RCX;
  int in_EDX;
  int in_ESI;
  CUPDLPdense *in_RDI;
  int in_R8D;
  cupdlp_retcode retcode;
  uint in_stack_ffffffffffffffd8;
  uint uVar2;
  
  uVar2 = 0;
  pcVar1 = (cupdlp_float *)calloc((long)(in_ESI * in_EDX),8);
  in_RDI->data = pcVar1;
  if (in_RDI->data == (cupdlp_float *)0x0) {
    uVar2 = 1;
  }
  else if (in_R8D == 0) {
    dense_copy((CUPDLPdense *)(ulong)uVar2,(CUPDLPdense *)(ulong)in_stack_ffffffffffffffd8);
  }
  else if (in_R8D == 1) {
    csr2dense(in_RDI,(CUPDLPcsr *)in_RCX);
  }
  else if (in_R8D == 2) {
    csc2dense(in_RDI,in_RCX);
  }
  return uVar2;
}

Assistant:

cupdlp_retcode dense_alloc_matrix(CUPDLPdense *dense, cupdlp_int nRows,
                                  cupdlp_int nCols, void *src,
                                  CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_init_zero_vec_double(dense->data, nRows * nCols);

  switch (src_matrix_format) {
    case DENSE:
      dense_copy(dense, (CUPDLPdense *)src);
      break;
    case CSR:
      csr2dense(dense, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc2dense(dense, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}